

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O1

void mxx::impl::
     distribute_scatter<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>>
               (__normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                begin,__normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                      end,
               __normal_iterator<unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
               out,size_t total_size,comm *comm)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int root;
  int i;
  pair<unsigned_long,_int> result;
  size_t local_90;
  int local_88;
  custom_op<std::pair<unsigned_long,_int>,_true> local_80;
  int local_40 [4];
  
  local_88 = comm->m_rank;
  local_90 = (long)end._M_current - (long)begin._M_current;
  custom_op<std::pair<unsigned_long,int>,true>::
  custom_op<mxx::max_element<unsigned_long>(unsigned_long_const&,mxx::comm_const&)::_lambda(std::pair<unsigned_long,int>const&,std::pair<unsigned_long,int>const&)_1_>
            ((custom_op<std::pair<unsigned_long,int>,true> *)&local_80);
  local_40[0] = 0;
  local_40[1] = 0;
  local_40[2] = 0;
  MPI_Allreduce(&local_90,local_40,1,local_80.m_type_copy,local_80.m_op,comm->mpi_comm);
  custom_op<std::pair<unsigned_long,_int>,_true>::~custom_op(&local_80);
  local_90 = CONCAT44(local_90._4_4_,local_40[2]);
  iVar2 = right_shift<int>((int *)&local_90,comm);
  local_80._vptr_custom_op._0_4_ = (uint)(iVar2 == (int)local_90 || comm->m_rank == 0);
  MPI_Allreduce(&local_80,local_40,1,&ompi_mpi_int,&ompi_mpi_op_land,comm->mpi_comm);
  if (local_40[0] == 0) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_80);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
           (ulong)(uint)local_80._vptr_custom_op,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
           ,0x41,"distribute_scatter","mxx::all_same(root, comm)");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  uVar4 = (ulong)comm->m_size;
  iVar2 = comm->m_rank;
  if (iVar2 == (int)local_90) {
    if ((long)end._M_current - (long)begin._M_current != total_size) {
      MPI_Comm_rank(&ompi_mpi_comm_world,&local_80);
      printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
             (ulong)(uint)local_80._vptr_custom_op,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
             ,0x46,"distribute_scatter","local_size == total_size");
      fflush(_stdout);
      MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80,(long)comm->m_size
               ,(allocator_type *)local_40);
    iVar1 = comm->m_size;
    if (0 < (long)iVar1) {
      uVar3 = 0;
      do {
        *(ulong *)(CONCAT44(local_80._vptr_custom_op._4_4_,(uint)local_80._vptr_custom_op) +
                  uVar3 * 8) = total_size / uVar4 + (ulong)(uVar3 < total_size % uVar4);
        uVar3 = uVar3 + 1;
      } while ((long)iVar1 != uVar3);
    }
    scatterv<unsigned_char>
              (begin._M_current,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80,
               out._M_current,total_size / uVar4 + (ulong)((ulong)(long)iVar2 < total_size % uVar4),
               (int)local_90,comm);
    if ((void *)CONCAT44(local_80._vptr_custom_op._4_4_,(uint)local_80._vptr_custom_op) !=
        (void *)0x0) {
      operator_delete((void *)CONCAT44(local_80._vptr_custom_op._4_4_,(uint)local_80._vptr_custom_op
                                      ));
    }
  }
  else {
    scatterv_recv<unsigned_char>
              (out._M_current,total_size / uVar4 + (ulong)((ulong)(long)iVar2 < total_size % uVar4),
               (int)local_90,comm);
  }
  return;
}

Assistant:

void distribute_scatter(_InIterator begin, _InIterator end, _OutIterator out, size_t total_size, const mxx::comm& comm) {
        size_t local_size = std::distance(begin, end);
        // get root
        std::pair<size_t, int> max_pos = mxx::max_element(local_size, comm);
        int root = max_pos.second;
        MXX_ASSERT(mxx::all_same(root, comm));
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());


        if (comm.rank() == root) {
            MXX_ASSERT(local_size == total_size);
            // use scatterv to send
            std::vector<size_t> send_sizes(comm.size());
            for (int i = 0; i < comm.size(); ++i) {
                send_sizes[i] = part.local_size(i);
            }
            // TODO: scatterv with iterators rather than pointers
            mxx::scatterv(&(*begin), send_sizes, &(*out), part.local_size(), root, comm);
        } else {
            // use scatterv to receive
            size_t recv_size = part.local_size();
            mxx::scatterv_recv(&(*out), recv_size, root, comm);
        }
    }